

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_12::PathVerifier::VerifyPolicies
          (PathVerifier *this,ParsedCertificate *cert,bool is_target_cert,CertErrors *errors)

{
  Input policy;
  Input policy_00;
  Input policy_01;
  Input lhs;
  bool bVar1;
  bool bVar2;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *this_00;
  reference pIVar3;
  pointer ppVar4;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_190;
  pointer local_178;
  pointer pIStack_170;
  type *local_168;
  type *parent_policies;
  type *p_oid_1;
  _Self local_150;
  iterator __end4;
  iterator __begin4;
  map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
  *__range4;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_110;
  uchar *local_f8;
  uchar *puStack_f0;
  _Self local_e8;
  _Self local_e0;
  iterator iter;
  Span<const_unsigned_char> local_c8;
  uchar *local_b8;
  uchar *puStack_b0;
  undefined1 auStack_a8 [8];
  Input p_oid;
  __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
  local_90;
  const_iterator __end3;
  const_iterator __begin3;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *__range3;
  undefined1 local_60 [7];
  bool cert_has_any_policy;
  LevelDetails previous_level;
  CertErrors *errors_local;
  bool is_target_cert_local;
  ParsedCertificate *cert_local;
  PathVerifier *this_local;
  
  previous_level._48_8_ = errors;
  bVar1 = ParsedCertificate::has_policy_oids(cert);
  if ((bVar1) && (bVar1 = ValidPolicyGraph::IsNull(&this->valid_policy_graph_), !bVar1)) {
    ValidPolicyGraph::StartLevel((LevelDetails *)local_60,&this->valid_policy_graph_);
    bVar1 = false;
    this_00 = ParsedCertificate::policy_oids(cert);
    __end3 = ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::begin(this_00);
    local_90._M_current =
         (Input *)::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=(&__end3,&local_90), bVar2) {
      pIVar3 = __gnu_cxx::
               __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
               ::operator*(&__end3);
      local_b8 = (pIVar3->data_).data_;
      puStack_b0 = (uchar *)(pIVar3->data_).size_;
      auStack_a8 = (undefined1  [8])local_b8;
      p_oid.data_.data_ = puStack_b0;
      Span<unsigned_char_const>::Span<4ul>
                ((Span<unsigned_char_const> *)&iter,(uchar (*) [4])&kAnyPolicyOid);
      bssl::der::Input::Input((Input *)&local_c8,_iter);
      lhs.data_.size_ = (size_t)puStack_b0;
      lhs.data_.data_ = local_b8;
      bVar2 = bssl::der::operator==(lhs,(Input)local_c8);
      if (bVar2) {
        bVar1 = true;
      }
      else {
        local_e0._M_node =
             (_Base_ptr)
             ::std::
             map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
             ::find((map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                     *)local_60,(key_type *)auStack_a8);
        local_e8._M_node =
             (_Base_ptr)
             ::std::
             map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
             ::end((map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                    *)local_60);
        bVar2 = ::std::operator!=(&local_e0,&local_e8);
        if (bVar2) {
          local_f8 = (uchar *)auStack_a8;
          puStack_f0 = p_oid.data_.data_;
          ppVar4 = ::std::
                   _Rb_tree_iterator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>
                   ::operator->(&local_e0);
          ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::vector
                    (&local_110,&ppVar4->second);
          policy_01.data_.size_ = (size_t)puStack_f0;
          policy_01.data_.data_ = local_f8;
          ValidPolicyGraph::AddNode(&this->valid_policy_graph_,policy_01,&local_110);
          ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~vector(&local_110);
          ::std::
          map<bssl::der::Input,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>>>
          ::erase_abi_cxx11_((map<bssl::der::Input,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>>>
                              *)local_60,(iterator)local_e0._M_node);
        }
        else if (((byte)previous_level.expected_policy_map._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count & 1) != 0) {
          policy_00.data_.size_ = (size_t)p_oid.data_.data_;
          policy_00.data_.data_ = (uchar *)auStack_a8;
          ValidPolicyGraph::AddNodeWithParentAnyPolicy(&this->valid_policy_graph_,policy_00);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
      ::operator++(&__end3);
    }
    if ((bVar1) &&
       ((this->inhibit_any_policy_ != 0 ||
        ((!is_target_cert && (bVar1 = IsSelfIssued(cert), bVar1)))))) {
      __end4 = ::std::
               map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
               ::begin((map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                        *)local_60);
      local_150._M_node =
           (_Base_ptr)
           ::std::
           map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
           ::end((map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                  *)local_60);
      while (bVar1 = ::std::operator!=(&__end4,&local_150), bVar1) {
        p_oid_1 = &::std::
                   _Rb_tree_iterator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>
                   ::operator*(&__end4)->first;
        parent_policies =
             (type *)::std::
                     get<0ul,bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>
                               ((pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
                                 *)p_oid_1);
        local_168 = ::std::
                    get<1ul,bssl::der::Input_const,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>
                              ((pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
                                *)p_oid_1);
        local_178 = (parent_policies->
                    super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>)._M_impl
                    .super__Vector_impl_data._M_start;
        pIStack_170 = (parent_policies->
                      super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
        ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::vector
                  (&local_190,local_168);
        policy.data_.size_ = (size_t)pIStack_170;
        policy.data_.data_ = (uchar *)local_178;
        ValidPolicyGraph::AddNode(&this->valid_policy_graph_,policy,&local_190);
        ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~vector(&local_190);
        ::std::
        _Rb_tree_iterator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>
        ::operator++(&__end4);
      }
      if (((byte)previous_level.expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_node_count
          & 1) != 0) {
        ValidPolicyGraph::AddAnyPolicyNode(&this->valid_policy_graph_);
      }
    }
    ValidPolicyGraph::LevelDetails::~LevelDetails((LevelDetails *)local_60);
  }
  bVar1 = ParsedCertificate::has_policy_oids(cert);
  if (!bVar1) {
    ValidPolicyGraph::SetNull(&this->valid_policy_graph_);
  }
  if ((this->explicit_policy_ == 0) &&
     (bVar1 = ValidPolicyGraph::IsNull(&this->valid_policy_graph_), bVar1)) {
    CertErrors::AddError((CertErrors *)previous_level._48_8_,"No valid policy");
  }
  return;
}

Assistant:

void PathVerifier::VerifyPolicies(const ParsedCertificate &cert,
                                  bool is_target_cert, CertErrors *errors) {
  // From RFC 5280 section 6.1.3:
  //
  //  (d)  If the certificate policies extension is present in the
  //       certificate and the valid_policy_tree is not NULL, process
  //       the policy information by performing the following steps in
  //       order:
  if (cert.has_policy_oids() && !valid_policy_graph_.IsNull()) {
    ValidPolicyGraph::LevelDetails previous_level =
        valid_policy_graph_.StartLevel();

    //     (1)  For each policy P not equal to anyPolicy in the
    //          certificate policies extension, let P-OID denote the OID
    //          for policy P and P-Q denote the qualifier set for policy
    //          P.  Perform the following steps in order:
    bool cert_has_any_policy = false;
    for (der::Input p_oid : cert.policy_oids()) {
      if (p_oid == der::Input(kAnyPolicyOid)) {
        cert_has_any_policy = true;
        continue;
      }

      //        (i)   For each node of depth i-1 in the valid_policy_tree
      //              where P-OID is in the expected_policy_set, create a
      //              child node as follows: set the valid_policy to P-OID,
      //              set the qualifier_set to P-Q, and set the
      //              expected_policy_set to {P-OID}.
      auto iter = previous_level.expected_policy_map.find(p_oid);
      if (iter != previous_level.expected_policy_map.end()) {
        valid_policy_graph_.AddNode(
            p_oid, /*parent_policies=*/std::move(iter->second));
        previous_level.expected_policy_map.erase(iter);
      } else if (previous_level.has_any_policy) {
        //      (ii)  If there was no match in step (i) and the
        //            valid_policy_tree includes a node of depth i-1 with
        //            the valid_policy anyPolicy, generate a child node with
        //            the following values: set the valid_policy to P-OID,
        //            set the qualifier_set to P-Q, and set the
        //            expected_policy_set to  {P-OID}.
        valid_policy_graph_.AddNodeWithParentAnyPolicy(p_oid);
      }
    }

    //     (2)  If the certificate policies extension includes the policy
    //          anyPolicy with the qualifier set AP-Q and either (a)
    //          inhibit_anyPolicy is greater than 0 or (b) i<n and the
    //          certificate is self-issued, then:
    //
    //          For each node in the valid_policy_tree of depth i-1, for
    //          each value in the expected_policy_set (including
    //          anyPolicy) that does not appear in a child node, create a
    //          child node with the following values: set the valid_policy
    //          to the value from the expected_policy_set in the parent
    //          node, set the qualifier_set to AP-Q, and set the
    //          expected_policy_set to the value in the valid_policy from
    //          this node.
    if (cert_has_any_policy && ((inhibit_any_policy_ > 0) ||
                                (!is_target_cert && IsSelfIssued(cert)))) {
      for (auto &[p_oid, parent_policies] :
           previous_level.expected_policy_map) {
        valid_policy_graph_.AddNode(p_oid, std::move(parent_policies));
      }
      if (previous_level.has_any_policy) {
        valid_policy_graph_.AddAnyPolicyNode();
      }
    }

    //     (3)  If there is a node in the valid_policy_tree of depth i-1
    //          or less without any child nodes, delete that node.  Repeat
    //          this step until there are no nodes of depth i-1 or less
    //          without children.
    //
    // This implementation does this as part of GetUserConstrainedPolicySet().
    // Only the current level needs to be pruned to compute the policy graph.
  }

  //  (e)  If the certificate policies extension is not present, set the
  //       valid_policy_tree to NULL.
  if (!cert.has_policy_oids()) {
    valid_policy_graph_.SetNull();
  }

  //  (f)  Verify that either explicit_policy is greater than 0 or the
  //       valid_policy_tree is not equal to NULL;
  if (!((explicit_policy_ > 0) || !valid_policy_graph_.IsNull())) {
    errors->AddError(cert_errors::kNoValidPolicy);
  }
}